

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O2

bool __thiscall
AddrManImpl::Add_(AddrManImpl *this,vector<CAddress,_std::allocator<CAddress>_> *vAddr,
                 CNetAddr *source,seconds time_penalty)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  CAddress *pCVar4;
  pointer addr;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  unsigned_long local_68;
  int local_5c;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = 0;
  pCVar4 = (CAddress *)vAddr;
  for (addr = (vAddr->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
              super__Vector_impl_data._M_start;
      addr != (vAddr->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
              super__Vector_impl_data._M_finish; addr = addr + 1) {
    pCVar4 = addr;
    bVar1 = AddSingle(this,addr,source,time_penalty);
    iVar3 = iVar3 + (uint)bVar1;
  }
  local_5c = iVar3;
  if (iVar3 == 0) {
    bVar1 = false;
  }
  else {
    bVar2 = ::LogAcceptCategory(ADDRMAN,(Level)pCVar4);
    bVar1 = true;
    if (bVar2) {
      local_68 = ((long)(vAddr->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(vAddr->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                       super__Vector_impl_data._M_start) / 0x38;
      CNetAddr::ToStringAddr_abi_cxx11_(&local_58,source);
      logging_function._M_str = "Add_";
      logging_function._M_len = 4;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
      ;
      source_file._M_len = 0x5b;
      LogPrintFormatInternal<int,unsigned_long,std::__cxx11::string,int,int>
                (logging_function,source_file,0x2b0,ADDRMAN,Debug,
                 (ConstevalFormatString<5U>)0x6cae0d,&local_5c,&local_68,&local_58,&this->nTried,
                 &this->nNew);
      std::__cxx11::string::~string((string *)&local_58);
      bVar1 = 0 < local_5c;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool AddrManImpl::Add_(const std::vector<CAddress>& vAddr, const CNetAddr& source, std::chrono::seconds time_penalty)
{
    int added{0};
    for (std::vector<CAddress>::const_iterator it = vAddr.begin(); it != vAddr.end(); it++) {
        added += AddSingle(*it, source, time_penalty) ? 1 : 0;
    }
    if (added > 0) {
        LogDebug(BCLog::ADDRMAN, "Added %i addresses (of %i) from %s: %i tried, %i new\n", added, vAddr.size(), source.ToStringAddr(), nTried, nNew);
    }
    return added > 0;
}